

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

UInt32 crnlib::RcTree_GetPrice(UInt16 *probs,int numBitLevels,UInt32 symbol,UInt32 *ProbPrices)

{
  UInt32 local_24;
  UInt32 price;
  UInt32 *ProbPrices_local;
  UInt32 symbol_local;
  int numBitLevels_local;
  UInt16 *probs_local;
  
  local_24 = 0;
  for (ProbPrices_local._0_4_ = 1 << ((byte)numBitLevels & 0x1f) | symbol;
      (uint)ProbPrices_local != 1; ProbPrices_local._0_4_ = (uint)ProbPrices_local >> 1) {
    local_24 = ProbPrices
               [(int)((uint)probs[(uint)ProbPrices_local >> 1] ^
                     -((uint)ProbPrices_local & 1) & 0x7ff) >> 4] + local_24;
  }
  return local_24;
}

Assistant:

static UInt32 RcTree_GetPrice(const CLzmaProb* probs, int numBitLevels, UInt32 symbol, UInt32* ProbPrices) {
  UInt32 price = 0;
  symbol |= (1 << numBitLevels);
  while (symbol != 1) {
    price += GET_PRICEa(probs[symbol >> 1], symbol & 1);
    symbol >>= 1;
  }
  return price;
}